

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglBufferAgeTests.cpp
# Opt level: O0

void __thiscall
deqp::egl::anon_unknown_0::ReferenceRenderer::render
          (ReferenceRenderer *this,Surface *target,Frame *frame)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  int x;
  int y;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  ColoredRect *pCVar8;
  const_reference pvVar9;
  PixelBufferAccess local_90;
  PixelBufferAccess local_68;
  undefined1 local_40 [8];
  UVec4 color;
  ColoredRect *coloredRect;
  size_t drawNdx;
  Frame *frame_local;
  Surface *target_local;
  ReferenceRenderer *this_local;
  
  for (coloredRect = (ColoredRect *)0x0;
      pCVar8 = (ColoredRect *)
               std::
               vector<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
               ::size(&frame->draws), coloredRect < pCVar8;
      coloredRect = (ColoredRect *)((long)(coloredRect->bottomLeft).m_data + 1)) {
    pvVar9 = std::
             vector<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
             ::operator[](&frame->draws,(size_type)coloredRect);
    color.m_data._8_8_ = &pvVar9->rect;
    pvVar9 = std::
             vector<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
             ::operator[](&frame->draws,(size_type)coloredRect);
    if ((pvVar9->drawType == DRAWTYPE_GLES2_RENDER) ||
       (pvVar9 = std::
                 vector<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
                 ::operator[](&frame->draws,(size_type)coloredRect),
       pvVar9->drawType == DRAWTYPE_GLES2_CLEAR)) {
      bVar1 = tcu::Vector<unsigned_char,_3>::x
                        ((Vector<unsigned_char,_3> *)(color.m_data._8_8_ + 0x10));
      bVar2 = tcu::Vector<unsigned_char,_3>::y
                        ((Vector<unsigned_char,_3> *)(color.m_data._8_8_ + 0x10));
      bVar3 = tcu::Vector<unsigned_char,_3>::z
                        ((Vector<unsigned_char,_3> *)(color.m_data._8_8_ + 0x10));
      tcu::Vector<unsigned_int,_4>::Vector
                ((Vector<unsigned_int,_4> *)local_40,(uint)bVar1,(uint)bVar2,(uint)bVar3,0xff);
      tcu::Surface::getAccess(&local_90,target);
      x = tcu::Vector<int,_2>::x((Vector<int,_2> *)color.m_data._8_8_);
      y = tcu::Vector<int,_2>::y((Vector<int,_2> *)color.m_data._8_8_);
      iVar4 = tcu::Vector<int,_2>::x((Vector<int,_2> *)(color.m_data._8_8_ + 8));
      iVar5 = tcu::Vector<int,_2>::x((Vector<int,_2> *)color.m_data._8_8_);
      iVar6 = tcu::Vector<int,_2>::y((Vector<int,_2> *)(color.m_data._8_8_ + 8));
      iVar7 = tcu::Vector<int,_2>::y((Vector<int,_2> *)color.m_data._8_8_);
      tcu::getSubregion(&local_68,&local_90,x,y,iVar4 - iVar5,iVar6 - iVar7);
      tcu::clear(&local_68,(UVec4 *)local_40);
    }
  }
  return;
}

Assistant:

void ReferenceRenderer::render (tcu::Surface* target, const Frame& frame) const
{
	for (size_t drawNdx = 0; drawNdx < frame.draws.size(); drawNdx++)
	{
		const ColoredRect& coloredRect = frame.draws[drawNdx].rect;
		if (frame.draws[drawNdx].drawType == BufferAgeTest::DRAWTYPE_GLES2_RENDER || frame.draws[drawNdx].drawType == BufferAgeTest::DRAWTYPE_GLES2_CLEAR)
		{
			const tcu::UVec4 color(coloredRect.color.x(), coloredRect.color.y(), coloredRect.color.z(), 255);
			tcu::clear(tcu::getSubregion(target->getAccess(), coloredRect.bottomLeft.x(), coloredRect.bottomLeft.y(),
										 coloredRect.topRight.x()-coloredRect.bottomLeft.x(), coloredRect.topRight.y()-coloredRect.bottomLeft.y()), color);
		}
		else
			DE_ASSERT(false);
	}
}